

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

void __thiscall ON_HermiteSurface::ON_HermiteSurface(ON_HermiteSurface *this)

{
  this->m_u_count = 0;
  this->m_v_count = 0;
  (this->m_u_parameters)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  (this->m_u_parameters).m_a = (double *)0x0;
  (this->m_u_parameters).m_count = 0;
  (this->m_u_parameters).m_capacity = 0;
  (this->m_v_parameters)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  (this->m_v_parameters).m_a = (double *)0x0;
  (this->m_v_parameters).m_count = 0;
  (this->m_v_parameters).m_capacity = 0;
  (this->m_grid_points)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_00815898;
  (this->m_grid_points).m_a = (ON_SimpleArray<ON_3dPoint> *)0x0;
  (this->m_grid_points).m_count = 0;
  (this->m_grid_points).m_capacity = 0;
  (this->m_u_tangents)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008158e0;
  (this->m_u_tangents).m_a = (ON_SimpleArray<ON_3dVector> *)0x0;
  (this->m_u_tangents).m_count = 0;
  (this->m_u_tangents).m_capacity = 0;
  (this->m_v_tangents)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008158e0;
  (this->m_v_tangents).m_a = (ON_SimpleArray<ON_3dVector> *)0x0;
  (this->m_v_tangents).m_count = 0;
  (this->m_v_tangents).m_capacity = 0;
  (this->m_twists)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008158e0;
  (this->m_twists).m_a = (ON_SimpleArray<ON_3dVector> *)0x0;
  (this->m_twists).m_count = 0;
  (this->m_twists).m_capacity = 0;
  return;
}

Assistant:

ON_HermiteSurface::ON_HermiteSurface()
  : m_u_count(0)
  , m_v_count(0)
{
}